

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O2

string * duckdb_mbedtls::MbedTlsWrapper::ComputeSha256Hash
                   (string *__return_storage_ptr__,string *file_content)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  ComputeSha256Hash((file_content->_M_dataplus)._M_p,file_content->_M_string_length,
                    (__return_storage_ptr__->_M_dataplus)._M_p);
  return __return_storage_ptr__;
}

Assistant:

string MbedTlsWrapper::ComputeSha256Hash(const string &file_content) {
	string hash;
	hash.resize(MbedTlsWrapper::SHA256_HASH_LENGTH_BYTES);
	ComputeSha256Hash(file_content.data(), file_content.size(), (char *)hash.data());
	return hash;
}